

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O1

int run_with_options(Options *options)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pTVar3;
  pointer ppFVar4;
  pointer pPVar5;
  int iVar6;
  LexData *data;
  _func_void *p_Var7;
  LexData *pLVar8;
  pointer pLVar9;
  Token *tok;
  pointer pTVar10;
  ParserData *data_4;
  pointer pbVar11;
  ParserData *pPVar12;
  LexData *data_3;
  pointer ppFVar13;
  Stopwatch t;
  Program prog;
  KeywordStats keyword_stats;
  thread_pool pool;
  duration local_460;
  _Any_data local_458;
  code *local_448;
  code *pcStack_440;
  __native_type local_438;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  vector<LexData,_std::allocator<LexData>_> local_3e8;
  vector<ParserData,_std::allocator<ParserData>_> vStack_3d0;
  undefined1 local_3b8 [8];
  unsigned_long *local_3b0;
  unsigned_long local_3a8;
  unsigned_long local_3a0 [2];
  __native_type *local_390;
  thread_pool local_130;
  
  printf("running command \"%s\"\n",(options->command)._M_dataplus._M_p);
  local_460.__r = 0;
  local_460.__r = std::chrono::_V2::system_clock::now();
  thread_pool::thread_pool(&local_130,(long)options->threads);
  vStack_3d0.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
  super__Vector_impl_data._M_finish = (ParserData *)0x0;
  vStack_3d0.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_3d0.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
  super__Vector_impl_data._M_start = (ParserData *)0x0;
  local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.super__Vector_impl_data.
  _M_start = (LexData *)0x0;
  local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.super__Vector_impl_data.
  _M_finish = (LexData *)0x0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_408 = 0;
  uStack_400 = 0;
  local_438.__data.__list.__next = (__pthread_internal_list *)0x0;
  uStack_410 = 0;
  local_438._16_8_ = 0;
  local_438.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_438.__align = 0;
  local_438._8_8_ = 0;
  pbVar11 = (options->parse_files).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (options->parse_files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != pbVar1) {
    do {
      pcVar2 = (pbVar11->_M_dataplus)._M_p;
      local_3b8 = (undefined1  [8])&local_130;
      local_3b0 = local_3a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,pcVar2,pcVar2 + pbVar11->_M_string_length);
      local_390 = &local_438;
      local_458._M_unused._M_object = (void *)0x0;
      local_458._8_8_ = 0;
      local_448 = (code *)0x0;
      pcStack_440 = (code *)0x0;
      p_Var7 = (_func_void *)operator_new(0x30);
      *(undefined1 (*) [8])p_Var7 = local_3b8;
      *(_func_void **)(p_Var7 + 8) = p_Var7 + 0x18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(p_Var7 + 8),local_3b0,local_3a8 + (long)local_3b0);
      *(__native_type **)(p_Var7 + 0x28) = local_390;
      pcStack_440 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]cppillr/cppillr/cppillr.cpp:379:7)>
                    ::_M_invoke;
      local_448 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]cppillr/cppillr/cppillr.cpp:379:7)>
                  ::_M_manager;
      local_458._M_unused._M_function_pointer = p_Var7;
      thread_pool::execute(&local_130,(function<void_()> *)&local_458);
      if (local_448 != (code *)0x0) {
        (*local_448)(&local_458,&local_458,__destroy_functor);
      }
      if (local_3b0 != local_3a0) {
        operator_delete(local_3b0,local_3a0[0] + 1);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar1);
  }
  thread_pool::wait_all(&local_130);
  if (options->show_time == true) {
    Stopwatch::watch((Stopwatch *)&local_460,"parse files");
  }
  iVar6 = std::__cxx11::string::compare((char *)options);
  if (iVar6 == 0) {
    docs::run(options,&local_130,(Program *)&local_438.__data);
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)options);
    if (iVar6 == 0) {
      iVar6 = run::run(options,&local_130,(Program *)&local_438.__data);
      goto LAB_001047f0;
    }
  }
  iVar6 = 0;
LAB_001047f0:
  pLVar8 = local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (options->count_tokens == true) {
    for (; pLVar8 != local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                     super__Vector_impl_data._M_finish; pLVar8 = pLVar8 + 1) {
    }
    printf("total tokens %d\n");
  }
  pLVar8 = local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (options->count_lines == true) {
    for (; pLVar8 != local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                     super__Vector_impl_data._M_finish; pLVar8 = pLVar8 + 1) {
      for (pTVar10 = (pLVar8->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pTVar10 !=
          (pLVar8->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
          super__Vector_impl_data._M_finish; pTVar10 = pTVar10 + 1) {
      }
    }
    printf("total lines %d\n");
  }
  if (options->keyword_stats == true) {
    memset(local_3b8,0,0x288);
    for (pLVar9 = local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pLVar9 != local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                  super__Vector_impl_data._M_finish; pLVar9 = pLVar9 + 1) {
      pTVar3 = (pLVar9->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pTVar10 = (pLVar9->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_start; pTVar10 != pTVar3; pTVar10 = pTVar10 + 1) {
        if (pTVar10->kind == Keyword) {
          *(long *)(local_3b8 + (long)pTVar10->i * 8) =
               *(long *)(local_3b8 + (long)pTVar10->i * 8) + 1;
        }
      }
    }
    KeywordStats::print((KeywordStats *)local_3b8);
  }
  pLVar9 = local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar8 = local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (options->show_tokens == true) {
    for (; pLVar8 != pLVar9; pLVar8 = pLVar8 + 1) {
      show_tokens(pLVar8);
    }
  }
  pPVar5 = vStack_3d0.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar12 = vStack_3d0.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (options->show_ast == true) {
    for (; pPVar12 != pPVar5; pPVar12 = pPVar12 + 1) {
      ppFVar4 = (pPVar12->functions).
                super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppFVar13 = (pPVar12->functions).
                      super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppFVar13 != ppFVar4; ppFVar13 = ppFVar13 + 1
          ) {
        show_ast_node(&(*ppFVar13)->super_Node,0);
      }
    }
  }
  pLVar9 = local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar8 = local_3e8.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (options->show_includes == true) {
    for (; pLVar8 != pLVar9; pLVar8 = pLVar8 + 1) {
      show_includes(pLVar8);
    }
  }
  pPVar5 = vStack_3d0.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar12 = vStack_3d0.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (options->show_functions == true) {
    for (; pPVar12 != pPVar5; pPVar12 = pPVar12 + 1) {
      show_functions(pPVar12,options->show_tokens);
    }
  }
  std::vector<ParserData,_std::allocator<ParserData>_>::~vector(&vStack_3d0);
  std::vector<LexData,_std::allocator<LexData>_>::~vector(&local_3e8);
  thread_pool::~thread_pool(&local_130);
  return iVar6;
}

Assistant:

int run_with_options(const Options& options)
{
  std::printf("running command \"%s\"\n", options.command.c_str());
  int ret_value = 0;

  Stopwatch t;
  thread_pool pool(options.threads);
  Program prog;

  for (const auto& fn : options.parse_files) {
    pool.execute(
      [&pool, fn, &prog]{
        Lexer lexer;
        lexer.lex(fn);

        int i = prog.add_lex(lexer.move_data());

        pool.execute(
          [i, &prog]{
            LexData data;
            prog.get_lex(i, data);

            Parser parser(i);
            parser.parse(data);

            prog.add_parser_data(parser.move_data());
          });
      });
  }
  pool.wait_all();

  if (options.show_time)
    t.watch("parse files");

  if (options.command == "docs")
    docs::run(options, pool, prog);
  else if (options.command == "run")
    ret_value = run::run(options, pool, prog);

  if (options.count_tokens) {
    int total_tokens = 0;
    for (auto& data : prog.lex_data)
      total_tokens += data.tokens.size();

    std::printf("total tokens %d\n", total_tokens);
  }

  if (options.count_lines) {
    int total_lines = 0;
    for (auto& data : prog.lex_data)
      total_lines += count_lines(data);

    std::printf("total lines %d\n", total_lines);
  }

  if (options.keyword_stats) {
    KeywordStats keyword_stats;
    for (auto& data : prog.lex_data)
      keyword_stats.add(data);

    keyword_stats.print();
  }

  if (options.show_tokens) {
    for (auto& data : prog.lex_data)
      show_tokens(data);
  }

  if (options.show_ast) {
    for (auto& data : prog.parser_data)
      show_ast(data);
  }

  if (options.show_includes) {
    for (auto& data : prog.lex_data)
      show_includes(data);
  }

  if (options.show_functions) {
    for (const auto& data : prog.parser_data)
      show_functions(data, options.show_tokens);
  }

  return ret_value;
}